

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

CURLcode Curl_pp_vsendf(Curl_easy *data,pingpong *pp,char *fmt,__va_list_tag *args)

{
  dynbuf *s;
  connectdata *pcVar1;
  CURLcode CVar2;
  size_t len;
  char *ptr;
  curltime cVar3;
  ssize_t bytes_written;
  size_t local_38;
  
  local_38 = 0;
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    CVar2 = CURLE_SEND_ERROR;
  }
  else {
    s = &pp->sendbuf;
    Curl_dyn_reset(s);
    CVar2 = Curl_dyn_vaddf(s,fmt,args);
    if (CVar2 == CURLE_OK) {
      CVar2 = Curl_dyn_addn(s,"\r\n",2);
      if (CVar2 == CURLE_OK) {
        len = Curl_dyn_len(s);
        ptr = Curl_dyn_ptr(s);
        pp->nread_resp = 0;
        pp->linestart_resp = (data->state).buffer;
        pp->pending_resp = true;
        cVar3 = Curl_now();
        (pp->response).tv_sec = cVar3.tv_sec;
        (pp->response).tv_usec = cVar3.tv_usec;
        CVar2 = Curl_write(data,pcVar1->sock[0],ptr,len,(ssize_t *)&local_38);
        if (CVar2 == CURLE_OK) {
          Curl_debug(data,CURLINFO_HEADER_OUT,ptr,local_38);
          if (len - local_38 == 0) {
            pp->sendthis = (char *)0x0;
            pp->sendleft = 0;
            pp->sendsize = 0;
            cVar3 = Curl_now();
            (pp->response).tv_sec = cVar3.tv_sec;
            (pp->response).tv_usec = cVar3.tv_usec;
          }
          else {
            pp->sendthis = ptr;
            pp->sendsize = len;
            pp->sendleft = len - local_38;
          }
          CVar2 = CURLE_OK;
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_pp_vsendf(struct Curl_easy *data,
                        struct pingpong *pp,
                        const char *fmt,
                        va_list args)
{
  ssize_t bytes_written = 0;
  size_t write_len;
  char *s;
  CURLcode result;
  struct connectdata *conn = data->conn;

#ifdef HAVE_GSSAPI
  enum protection_level data_sec;
#endif

  DEBUGASSERT(pp->sendleft == 0);
  DEBUGASSERT(pp->sendsize == 0);
  DEBUGASSERT(pp->sendthis == NULL);

  if(!conn)
    /* can't send without a connection! */
    return CURLE_SEND_ERROR;

  Curl_dyn_reset(&pp->sendbuf);
  result = Curl_dyn_vaddf(&pp->sendbuf, fmt, args);
  if(result)
    return result;

  /* append CRLF */
  result = Curl_dyn_addn(&pp->sendbuf, "\r\n", 2);
  if(result)
    return result;

  write_len = Curl_dyn_len(&pp->sendbuf);
  s = Curl_dyn_ptr(&pp->sendbuf);
  Curl_pp_init(data, pp);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CMD;
#endif
  result = Curl_write(data, conn->sock[FIRSTSOCKET], s, write_len,
                      &bytes_written);
  if(result)
    return result;
#ifdef HAVE_GSSAPI
  data_sec = conn->data_prot;
  DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
  conn->data_prot = data_sec;
#endif

  Curl_debug(data, CURLINFO_HEADER_OUT, s, (size_t)bytes_written);

  if(bytes_written != (ssize_t)write_len) {
    /* the whole chunk was not sent, keep it around and adjust sizes */
    pp->sendthis = s;
    pp->sendsize = write_len;
    pp->sendleft = write_len - bytes_written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }

  return CURLE_OK;
}